

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O1

void __thiscall
soul::ArrayWithPreallocation<soul::Value,_8UL>::clear
          (ArrayWithPreallocation<soul::Value,_8UL> *this)

{
  long lVar1;
  ulong uVar2;
  
  if (this->numActive != 0) {
    lVar1 = 0;
    uVar2 = 0;
    do {
      soul::Value::~Value((Value *)((long)(&(this->items->allocatedData).allocatedData + -1) + lVar1
                                   ));
      uVar2 = uVar2 + 1;
      lVar1 = lVar1 + 0x40;
    } while (uVar2 < this->numActive);
  }
  this->numActive = 0;
  if (8 < this->numAllocated) {
    if (this->items != (Value *)0x0) {
      operator_delete__(this->items);
    }
    this->items = (Value *)this->space;
    this->numAllocated = 8;
  }
  return;
}

Assistant:

void clear() noexcept
    {
        for (size_t i = 0; i < numActive; ++i)
            items[i].~Item();

        numActive = 0;
        freeIfHeapAllocated();
    }